

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O3

MatchData * __thiscall
IntrusiveList<MatchData>::operator[](IntrusiveList<MatchData> *this,uint index)

{
  MatchData *pMVar1;
  uint uVar2;
  
  pMVar1 = this->head;
  uVar2 = index;
  if (pMVar1 != (MatchData *)0x0 && index != 0) {
    do {
      index = uVar2 - 1;
      pMVar1 = pMVar1->next;
      if (uVar2 == 1) break;
      uVar2 = index;
    } while (pMVar1 != (MatchData *)0x0);
  }
  if (index == 0) {
    return pMVar1;
  }
  __assert_fail("index == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x3f,"T *IntrusiveList<MatchData>::operator[](unsigned int) const [T = MatchData]")
  ;
}

Assistant:

T* operator[](unsigned index) const
	{
		T *curr = head;

		while(index && curr)
		{
			curr = curr->next;
			index--;
		}

		assert(index == 0);

		return curr;
	}